

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

uint64_t read_cpufreq(uint cpunum)

{
  int iVar1;
  FILE *__stream;
  FILE *fp;
  char buf [1024];
  uint64_t local_20;
  uint64_t val;
  uint64_t uStack_10;
  uint cpunum_local;
  
  val._4_4_ = cpunum;
  snprintf((char *)&fp,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",(ulong)cpunum)
  ;
  __stream = (FILE *)uv__open_file((char *)&fp);
  if (__stream == (FILE *)0x0) {
    uStack_10 = 0;
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%lu",&local_20);
    if (iVar1 != 1) {
      local_20 = 0;
    }
    fclose(__stream);
    uStack_10 = local_20;
  }
  return uStack_10;
}

Assistant:

static uint64_t read_cpufreq(unsigned int cpunum) {
  uint64_t val;
  char buf[1024];
  FILE* fp;

  snprintf(buf,
           sizeof(buf),
           "/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
           cpunum);

  fp = uv__open_file(buf);
  if (fp == NULL)
    return 0;

  if (fscanf(fp, "%" PRIu64, &val) != 1)
    val = 0;

  fclose(fp);

  return val;
}